

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c++
# Opt level: O0

ArrayPtr<const_unsigned_char> __thiscall
kj::BufferedInputStream::getReadBuffer(BufferedInputStream *this)

{
  ArrayPtr<const_unsigned_char> AVar1;
  int iVar2;
  undefined4 extraout_var;
  size_t sVar3;
  uchar *extraout_RDX;
  Fault local_28;
  Fault f;
  BufferedInputStream *this_local;
  ArrayPtr<const_unsigned_char> result;
  
  f.exception = (Exception *)this;
  iVar2 = (*(this->super_InputStream)._vptr_InputStream[4])();
  this_local = (BufferedInputStream *)CONCAT44(extraout_var,iVar2);
  result.ptr = extraout_RDX;
  sVar3 = ArrayPtr<const_unsigned_char>::size((ArrayPtr<const_unsigned_char> *)&this_local);
  if (sVar3 != 0) {
    AVar1.size_ = (size_t)result.ptr;
    AVar1.ptr = (uchar *)this_local;
    return AVar1;
  }
  _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[14]>
            (&local_28,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/io.c++"
             ,0x75,FAILED,"result.size() > 0","\"Premature EOF\"",(char (*) [14])"Premature EOF");
  _::Debug::Fault::fatal(&local_28);
}

Assistant:

ArrayPtr<const byte> BufferedInputStream::getReadBuffer() {
  auto result = tryGetReadBuffer();
  KJ_REQUIRE(result.size() > 0, "Premature EOF");
  return result;
}